

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O1

string * soul::trimCharacterAtStart(string *__return_storage_ptr__,string *s,char charToRemove)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  bool bVar6;
  
  sVar2 = s->_M_string_length;
  bVar6 = sVar2 == 0;
  if (!bVar6) {
    pcVar3 = (s->_M_dataplus)._M_p;
    cVar1 = *pcVar3;
    sVar5 = sVar2;
    pcVar4 = pcVar3;
    while (cVar1 == charToRemove) {
      sVar5 = sVar5 - 1;
      bVar6 = sVar5 == 0;
      if (bVar6) goto LAB_0019cac2;
      pcVar4 = pcVar4 + 1;
      cVar1 = *pcVar4;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__,pcVar4,pcVar3 + sVar2);
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_0019cac2:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string trimCharacterAtStart (const std::string& s, char charToRemove)
{
    for (auto c = s.begin(); c != s.end(); ++c)
        if (*c != charToRemove)
            return { c, s.end() };

    return {};
}